

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2centroids.cc
# Opt level: O3

S2Point * S2::TrueCentroid(S2Point *a,S2Point *b)

{
  S2Point *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = a->c_[0] + b->c_[0];
  dVar2 = a->c_[1] + b->c_[1];
  dVar3 = a->c_[2] + b->c_[2];
  dVar6 = dVar3 * dVar3 + dVar2 * dVar2 + dVar1 * dVar1;
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    in_RDI->c_[0] = 0.0;
    in_RDI->c_[1] = 0.0;
    in_RDI->c_[2] = 0.0;
    return in_RDI;
  }
  dVar7 = a->c_[1] - b->c_[1];
  dVar4 = a->c_[0] - b->c_[0];
  dVar5 = a->c_[2] - b->c_[2];
  dVar6 = SQRT((dVar5 * dVar5 + dVar7 * dVar7 + dVar4 * dVar4) / dVar6);
  in_RDI->c_[0] = dVar1 * dVar6;
  in_RDI->c_[1] = dVar2 * dVar6;
  in_RDI->c_[2] = dVar3 * dVar6;
  return in_RDI;
}

Assistant:

S2Point TrueCentroid(const S2Point& a, const S2Point& b) {
  // The centroid (multiplied by length) is a vector toward the midpoint
  // of the edge, whose length is twice the sine of half the angle between
  // the two vertices.  Defining theta to be this angle, we have:
  S2Point vdiff = a - b;  // Length == 2*sin(theta)
  S2Point vsum = a + b;   // Length == 2*cos(theta)
  double sin2 = vdiff.Norm2();
  double cos2 = vsum.Norm2();
  if (cos2 == 0) return S2Point();  // Ignore antipodal edges.
  return sqrt(sin2 / cos2) * vsum;  // Length == 2*sin(theta)
}